

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psocket.c
# Opt level: O3

pboolean p_socket_check_connect_result(PSocket *socket,PError **error)

{
  byte bVar1;
  int iVar2;
  PErrorIO code;
  uint uVar3;
  pint val;
  socklen_t optlen;
  int local_20 [2];
  
  if (socket == (PSocket *)0x0) {
    p_socket_check_connect_result_cold_2();
  }
  else {
    local_20[1] = 4;
    uVar3 = 1;
    iVar2 = getsockopt(socket->fd,1,4,local_20,(socklen_t *)(local_20 + 1));
    if (-1 < iVar2) {
      bVar1 = 8;
      if (local_20[0] != 0) {
        code = p_error_get_io_from_system(local_20[0]);
        p_error_set_error_p(error,code,local_20[0],"Error in socket layer");
        uVar3 = (uint)(local_20[0] == 0);
        bVar1 = (local_20[0] == 0) << 3;
      }
      socket->field_0x18 = socket->field_0x18 & 0xf7 | bVar1;
      return uVar3;
    }
    p_socket_check_connect_result_cold_1();
  }
  return 0;
}

Assistant:

P_LIB_API pboolean
p_socket_check_connect_result (PSocket  *socket,
			       PError	**error)
{
	socklen_t	optlen;
	pint		val;

	if (P_UNLIKELY (socket == NULL)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IO_INVALID_ARGUMENT,
				     0,
				     "Invalid input argument");
		return FALSE;
	}

	optlen = sizeof (val);

	if (P_UNLIKELY (getsockopt (socket->fd, SOL_SOCKET, SO_ERROR, (ppointer) &val, &optlen) < 0)) {
		p_error_set_error_p (error,
				     (pint) p_error_get_io_from_system (p_error_get_last_net ()),
				     (pint) p_error_get_last_net (),
				     "Failed to call getsockopt() to get connection status");
		return FALSE;
	}

	if (P_UNLIKELY (val != 0))
		p_error_set_error_p (error,
				     (pint) p_error_get_io_from_system (val),
				     val,
				     "Error in socket layer");

	socket->connected = (val == 0);

	return (val == 0);
}